

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O1

WallTime benchmark::walltime::Now(void)

{
  ulong uVar1;
  WallTimeImp *pWVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint32_t uVar6;
  ulong uVar7;
  WallTime WVar8;
  double dVar9;
  timeval tv;
  timeval local_38;
  
  uVar4 = CONCAT71((int7)((ulong)in_RAX >> 8),Now()::useCPUClock);
  if ((Now()::useCPUClock == '\0') &&
     (uVar4 = __cxa_guard_acquire(&Now()::useCPUClock), (int)uVar4 != 0)) {
    Now::useCPUClock = anon_unknown_1::UseCpuCycleClock();
    uVar4 = __cxa_guard_release(&Now()::useCPUClock);
  }
  if (Now::useCPUClock == true) {
    uVar5 = CONCAT71((int7)((ulong)uVar4 >> 8),(anonymous_namespace)::CPUWalltimeNow()::imp);
    if (((anonymous_namespace)::CPUWalltimeNow()::imp == '\0') &&
       (uVar5 = __cxa_guard_acquire(&(anonymous_namespace)::CPUWalltimeNow()::imp), (int)uVar5 != 0)
       ) {
      (anonymous_namespace)::CPUWalltimeNow()::imp = anon_unknown_1::WallTimeImp::GetWallTimeImp();
      uVar5 = __cxa_guard_release(&(anonymous_namespace)::CPUWalltimeNow()::imp);
    }
    pWVar2 = (anonymous_namespace)::CPUWalltimeNow()::imp;
    do {
      uVar7 = rdtsc();
      uVar7 = uVar7 & 0xffffffff00000000 | CONCAT44((int)(uVar5 >> 0x20),(int)uVar7);
      dVar9 = (double)(long)(uVar7 - pWVar2->base_cycletime_) * pWVar2->seconds_per_cycle_ +
              pWVar2->base_walltime_;
      uVar6 = (uint32_t)(uVar7 >> 0x20);
      if (pWVar2->last_adjust_time_ == uVar6) {
        return (double)(float)(pWVar2->drift_adjust_).super___atomic_base<int>._M_i + dVar9;
      }
      gettimeofday(&local_38,(__timezone_ptr_t)0x0);
      WVar8 = (double)local_38.tv_usec * 1e-06 + (double)local_38.tv_sec;
      uVar1 = rdtsc();
      uVar5 = CONCAT44(extraout_var,(int)uVar1);
    } while (pWVar2->max_interval_cycles_ < (long)((uVar1 & 0xffffffff00000000 | uVar5) - uVar7));
    LOCK();
    (pWVar2->drift_adjust_).super___atomic_base<int>._M_i = (__int_type)(float)(WVar8 - dVar9);
    UNLOCK();
    pWVar2->last_adjust_time_ = uVar6;
  }
  else {
    lVar3 = std::chrono::_V2::steady_clock::now();
    WVar8 = (double)lVar3 / 1000000000.0;
  }
  return WVar8;
}

Assistant:

WallTime Now()
{
  static bool useCPUClock = UseCpuCycleClock();
  if (useCPUClock) {
    return CPUWalltimeNow();
  } else {
    return ChronoWalltimeNow();
  }
}